

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QString,QSqlDriverCreatorBase*>::emplace<QSqlDriverCreatorBase*const&>
          (QHash<QString,_QSqlDriverCreatorBase_*> *this,QString *key,QSqlDriverCreatorBase **args)

{
  QString *in_RDI;
  long in_FS_OFFSET;
  piter pVar1;
  QString copy;
  QString *in_stack_ffffffffffffff88;
  QSqlDriverCreatorBase **args_00;
  QString *in_stack_ffffffffffffffa0;
  QHash<QString,_QSqlDriverCreatorBase_*> *in_stack_ffffffffffffffa8;
  QSqlDriverCreatorBase *local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_28 = (QSqlDriverCreatorBase *)0xaaaaaaaaaaaaaaaa;
  uStack_20 = 0xaaaaaaaaaaaaaaaa;
  args_00 = &local_28;
  QString::QString(in_RDI,in_stack_ffffffffffffff88);
  pVar1 = (piter)emplace<QSqlDriverCreatorBase*const&>
                           (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,args_00);
  QString::~QString((QString *)0x12bf66);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)pVar1;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(const Key &key, Args &&... args)
    {
        Key copy = key; // Needs to be explicit for MSVC 2019
        return emplace(std::move(copy), std::forward<Args>(args)...);
    }